

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O1

int create_monster_bottom_up(flatcc_builder_t *B,int flexible)

{
  flatcc_builder_ref_t fVar1;
  flatcc_builder_ref_t fVar2;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  flatcc_builder_ref_t fVar5;
  flatcc_builder_ref_t root;
  flatcc_builder_ref_t *pfVar6;
  undefined2 *puVar7;
  undefined8 *puVar8;
  undefined1 *puVar9;
  flatcc_builder_ref_t fVar10;
  uint8_t treasure [10];
  undefined8 local_40;
  undefined2 local_38;
  
  fVar1 = flatcc_builder_create_string_str(B,"Sword");
  fVar2 = flatcc_builder_create_string_str(B,"Axe");
  iVar3 = flatcc_builder_start_table(B,2);
  fVar4 = 0;
  if ((fVar1 != 0) && (iVar3 == 0)) {
    fVar4 = 0;
    pfVar6 = flatcc_builder_table_add_offset(B,0);
    if (pfVar6 != (flatcc_builder_ref_t *)0x0) {
      *pfVar6 = fVar1;
      puVar7 = (undefined2 *)flatcc_builder_table_add(B,1,2,2);
      if (puVar7 != (undefined2 *)0x0) {
        *puVar7 = 3;
        iVar3 = flatcc_builder_check_required(B,__MyGame_Sample_Weapon_required,0);
        if (iVar3 == 0) goto LAB_00103644;
        fVar4 = flatcc_builder_end_table(B);
      }
    }
  }
  iVar3 = flatcc_builder_start_table(B,2);
  fVar1 = 0;
  if ((fVar2 != 0) && (fVar1 = 0, iVar3 == 0)) {
    fVar1 = 0;
    pfVar6 = flatcc_builder_table_add_offset(B,0);
    if (pfVar6 != (flatcc_builder_ref_t *)0x0) {
      *pfVar6 = fVar2;
      puVar7 = (undefined2 *)flatcc_builder_table_add(B,1,2,2);
      if (puVar7 != (undefined2 *)0x0) {
        *puVar7 = 5;
        iVar3 = flatcc_builder_check_required(B,__MyGame_Sample_Weapon_required,0);
        if (iVar3 == 0) {
LAB_00103644:
          __assert_fail("flatcc_builder_check_required(B, __MyGame_Sample_Weapon_required, sizeof(__MyGame_Sample_Weapon_required) / sizeof(__MyGame_Sample_Weapon_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/samples/monster/generated/monster_builder.h"
                        ,0x3b,
                        "MyGame_Sample_Weapon_ref_t MyGame_Sample_Weapon_end(flatbuffers_builder_t *)"
                       );
        }
        fVar1 = flatcc_builder_end_table(B);
      }
    }
  }
  fVar2 = flatcc_builder_create_string_str(B,"Orc");
  local_40 = 0x706050403020100;
  local_38 = 0x908;
  fVar5 = flatcc_builder_create_vector(B,&local_40,10,1,1,0xffffffff);
  flatcc_builder_start_offset_vector(B);
  if (fVar4 != 0) {
    flatcc_builder_offset_vector_push(B,fVar4);
  }
  if (fVar1 != 0) {
    flatcc_builder_offset_vector_push(B,fVar1);
  }
  fVar4 = flatcc_builder_end_offset_vector(B);
  iVar3 = flatcc_builder_start_buffer(B,(char *)0x0,0,0);
  if (flexible == 0) {
    if (iVar3 != 0) {
      return 0;
    }
    iVar3 = flatcc_builder_start_table(B,10);
    root = 0;
    if (iVar3 == 0) {
      fVar10 = 0;
      puVar8 = (undefined8 *)flatcc_builder_table_add(B,0,0xc,4);
      root = 0;
      if (puVar8 != (undefined8 *)0x0) {
        *puVar8 = 0x400000003f800000;
        *(undefined4 *)(puVar8 + 1) = 0x40400000;
        root = fVar10;
        if (((((fVar2 != 0) &&
              (pfVar6 = flatcc_builder_table_add_offset(B,3), pfVar6 != (flatcc_builder_ref_t *)0x0)
              ) && (*pfVar6 = fVar2, fVar5 != 0)) &&
            ((pfVar6 = flatcc_builder_table_add_offset(B,5), pfVar6 != (flatcc_builder_ref_t *)0x0
             && (*pfVar6 = fVar5, fVar4 != 0)))) &&
           (pfVar6 = flatcc_builder_table_add_offset(B,7), pfVar6 != (flatcc_builder_ref_t *)0x0)) {
          *pfVar6 = fVar4;
          pfVar6 = flatcc_builder_table_add_offset(B,9);
          if (pfVar6 != (flatcc_builder_ref_t *)0x0) {
            *pfVar6 = fVar1;
            puVar7 = (undefined2 *)flatcc_builder_table_add(B,2,2,2);
            if (puVar7 != (undefined2 *)0x0) {
              *puVar7 = 300;
              puVar9 = (undefined1 *)flatcc_builder_table_add(B,6,1,1);
              if (puVar9 != (undefined1 *)0x0) {
                *puVar9 = 0;
                puVar9 = (undefined1 *)flatcc_builder_table_add(B,8,1,1);
                if (puVar9 != (undefined1 *)0x0) {
                  *puVar9 = 1;
                  root = MyGame_Sample_Monster_end(B);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (iVar3 == 0) {
      flatcc_builder_start_table(B,10);
    }
    puVar8 = (undefined8 *)flatcc_builder_table_add(B,0,0xc,4);
    if (puVar8 != (undefined8 *)0x0) {
      *puVar8 = 0x400000003f800000;
      *(undefined4 *)(puVar8 + 1) = 0x40400000;
    }
    puVar7 = (undefined2 *)flatcc_builder_table_add(B,2,2,2);
    if (puVar7 != (undefined2 *)0x0) {
      *puVar7 = 300;
    }
    if ((fVar2 != 0) &&
       (pfVar6 = flatcc_builder_table_add_offset(B,3), pfVar6 != (flatcc_builder_ref_t *)0x0)) {
      *pfVar6 = fVar2;
    }
    if ((fVar5 != 0) &&
       (pfVar6 = flatcc_builder_table_add_offset(B,5), pfVar6 != (flatcc_builder_ref_t *)0x0)) {
      *pfVar6 = fVar5;
    }
    puVar9 = (undefined1 *)flatcc_builder_table_add(B,6,1,1);
    if (puVar9 != (undefined1 *)0x0) {
      *puVar9 = 0;
    }
    if ((fVar4 != 0) &&
       (pfVar6 = flatcc_builder_table_add_offset(B,7), pfVar6 != (flatcc_builder_ref_t *)0x0)) {
      *pfVar6 = fVar4;
    }
    if ((fVar1 != 0) &&
       (puVar9 = (undefined1 *)flatcc_builder_table_add(B,8,1,1), puVar9 != (undefined1 *)0x0)) {
      *puVar9 = 1;
      pfVar6 = flatcc_builder_table_add_offset(B,9);
      if (pfVar6 != (flatcc_builder_ref_t *)0x0) {
        *pfVar6 = fVar1;
      }
    }
    iVar3 = flatcc_builder_check_required(B,__MyGame_Sample_Monster_required,0);
    if (iVar3 == 0) {
      __assert_fail("flatcc_builder_check_required(B, __MyGame_Sample_Monster_required, sizeof(__MyGame_Sample_Monster_required) / sizeof(__MyGame_Sample_Monster_required[0]) - 1)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/samples/monster/generated/monster_builder.h"
                    ,0x36,
                    "MyGame_Sample_Monster_ref_t MyGame_Sample_Monster_end(flatbuffers_builder_t *)"
                   );
    }
    root = flatcc_builder_end_table(B);
  }
  flatcc_builder_end_buffer(B,root);
  return 0;
}

Assistant:

int create_monster_bottom_up(flatcc_builder_t *B, int flexible)
{
    flatbuffers_string_ref_t weapon_one_name = flatbuffers_string_create_str(B, "Sword");
    int16_t weapon_one_damage = 3;

    flatbuffers_string_ref_t weapon_two_name = flatbuffers_string_create_str(B, "Axe");
    int16_t weapon_two_damage = 5;

    // Use the `MyGame_Sample_Weapon_create` shortcut to create Weapons
    // with all the fields set.
    //
    // In the C-API, verbs (here create) always follow the type name
    // (here Weapon), prefixed by the namespace (here MyGame_Sample_):
    // MyGame_Sample_Weapon_create(...), or ns(Weapone_create(...)).
    ns(Weapon_ref_t) sword = ns(Weapon_create(B, weapon_one_name, weapon_one_damage));
    ns(Weapon_ref_t) axe = ns(Weapon_create(B, weapon_two_name, weapon_two_damage));

    // Serialize a name for our monster, called "Orc".
    // The _str suffix indicates the source is an ascii-z string.
    flatbuffers_string_ref_t name = flatbuffers_string_create_str(B, "Orc");

    // Create a `vector` representing the inventory of the Orc. Each number
    // could correspond to an item that can be claimed after he is slain.
    uint8_t treasure[] = {0, 1, 2, 3, 4, 5, 6, 7, 8, 9};
    flatbuffers_uint8_vec_ref_t inventory;
    // `c_vec_len` is the convenience macro we defined earlier.
    inventory = flatbuffers_uint8_vec_create(B, treasure, c_vec_len(treasure));

    // Here we use a top-down approach locally to build a Weapons vector
    // in-place instead of creating a temporary external vector to use
    // as argument like we did with the `inventory` earlier on, but the
    // overall approach is still bottom-up.
    ns(Weapon_vec_start(B));
    ns(Weapon_vec_push(B, sword));
    ns(Weapon_vec_push(B, axe));
    ns(Weapon_vec_ref_t) weapons = ns(Weapon_vec_end(B));


    // Create a `Vec3`, representing the Orc's position in 3-D space.
    ns(Vec3_t) pos = { 1.0f, 2.0f, 3.0f };


    // Set his hit points to 300 and his mana to 150.
    int16_t hp = 300;
    // The default value is 150, so we will never store this field.
    int16_t mana = 150;

    // Create the equipment union. In the C++ language API this is given
    // as two arguments to the create call, or as two separate add
    // operations for the type and the table reference. Here we create
    // a single union value that carries both the type and reference.
    ns(Equipment_union_ref_t) equipped = ns(Equipment_as_Weapon(axe));

    if (!flexible) {
        // Finally, create the monster using the `Monster_create` helper function
        // to set all fields.
        //
        // Note that the Equipment union only take up one argument in C, where
        // C++ takes a type and an object argument.
        ns(Monster_create_as_root(B, &pos, mana, hp, name, inventory, ns(Color_Red),
                             weapons, equipped));

        // Unlike C++ we do not use a Finish call. Instead we use the
        // `create_as_root` action which has better type safety and
        // simplicity.
        //
        // However, we can also express this as:
        //
        // ns(Monster_ref_t) orc = ns(Monster_create(B, ...));
        // flatcc_builder_buffer_create(orc);
        //
        // In this approach the function should return the orc and
        // let a calling function handle the flatcc_buffer_create call
        // for a more composable setup that is also able to create child
        // monsters. In general, `flatcc_builder` calls are best isolated
        // in a containing driver function.

    } else {

        // A more flexible approach where we mix bottom-up and top-down
        // style. We still create child objects first, but then create
        // a top-down style monster object that we can manipulate in more
        // detail.

        // It is important to pair `start_as_root` with `end_as_root`.
        ns(Monster_start_as_root(B));
        ns(Monster_pos_create(B, 1.0f, 2.0f, 3.0f));
        // or alternatively
        //ns(Monster_pos_add(&pos);

        ns(Monster_hp_add(B, hp));
        // Notice that `Monser_name_add` adds a string reference unlike the
        // add_str and add_strn variants.
        ns(Monster_name_add(B, name));
        ns(Monster_inventory_add(B, inventory));
        ns(Monster_color_add(B, ns(Color_Red)));
        ns(Monster_weapons_add(B, weapons));
        ns(Monster_equipped_add(B, equipped));
        // Complete the monster object and make it the buffer root object.
        ns(Monster_end_as_root(B));

        // We could also drop the `as_root` suffix from Monster_start/end(B)
        // and add the table as buffer root later:
        //
        // ns(Monster_ref_t) orc = ns(Monster_start(B));
        // ...
        // ns(Monster_ref_t) orc = ns(Monster_end(B));
        // flatcc_builder_buffer_create(orc);
        //
        // It is best to keep the `flatcc_builder` calls in a containing
        // driver function for modularity.
    }
    return 0;
}